

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNodeIteratorImpl::DOMNodeIteratorImpl
          (DOMNodeIteratorImpl *this,DOMDocument *doc,DOMNode *root,ShowType whatToShow,
          DOMNodeFilter *nodeFilter,bool expandEntityRef)

{
  bool expandEntityRef_local;
  DOMNodeFilter *nodeFilter_local;
  ShowType whatToShow_local;
  DOMNode *root_local;
  DOMDocument *doc_local;
  DOMNodeIteratorImpl *this_local;
  
  DOMNodeIterator::DOMNodeIterator(&this->super_DOMNodeIterator);
  (this->super_DOMNodeIterator)._vptr_DOMNodeIterator =
       (_func_int **)&PTR__DOMNodeIteratorImpl_0052b638;
  this->fRoot = root;
  this->fDocument = doc;
  this->fWhatToShow = whatToShow;
  this->fNodeFilter = nodeFilter;
  this->fExpandEntityReferences = expandEntityRef;
  this->fDetached = false;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fForward = true;
  return;
}

Assistant:

DOMNodeIteratorImpl::DOMNodeIteratorImpl (DOMDocument* doc,
                                    DOMNode* root,
                                    DOMNodeFilter::ShowType whatToShow,
                                    DOMNodeFilter* nodeFilter,
                                    bool expandEntityRef)
:   fRoot(root),
    fDocument(doc),
    fWhatToShow(whatToShow),
    fNodeFilter(nodeFilter),
    fExpandEntityReferences(expandEntityRef),
    fDetached(false),
    fCurrentNode(0),
    fForward(true)
{

}